

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O0

bool __thiscall DirectivePsxObjImport::Validate(DirectivePsxObjImport *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  int local_1c;
  ValidateState *pVStack_18;
  int memory;
  ValidateState *state_local;
  DirectivePsxObjImport *this_local;
  
  pVStack_18 = state;
  state_local = (ValidateState *)this;
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  local_1c = (int)iVar2;
  PsxRelocator::relocate(&this->rel,&local_1c);
  FileManager::advanceMemory(g_fileManager,(long)local_1c);
  bVar1 = PsxRelocator::hasDataChanged(&this->rel);
  return bVar1;
}

Assistant:

bool DirectivePsxObjImport::Validate(const ValidateState &state)
{
	int memory = (int) g_fileManager->getVirtualAddress();
	rel.relocate(memory);
	g_fileManager->advanceMemory(memory);
	return rel.hasDataChanged();
}